

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionModel.hpp
# Opt level: O3

VectorXf __thiscall
eos::morphablemodel::draw_sample
          (morphablemodel *this,ExpressionModel *expression_model,
          vector<float,_std::allocator<float>_> *expression_coefficients)

{
  float *pfVar1;
  undefined8 *puVar2;
  __index_type _Var3;
  LhsNested __ptr;
  PointerType pfVar4;
  pointer pBVar5;
  float *pfVar6;
  ulong size_00;
  long lVar7;
  undefined8 uVar8;
  variant_alternative_t<0UL,_variant<PcaModel,_vector<Blendshape,_allocator<Blendshape>_>_>_>
  *coefficients;
  variant_alternative_t<1UL,_variant<PcaModel,_vector<Blendshape,_allocator<Blendshape>_>_>_>
  *blendshapes;
  runtime_error *this_00;
  Index index;
  ulong uVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long lVar10;
  long extraout_RDX_04;
  Index size;
  VectorXf VVar11;
  assign_op<float,_float> local_71;
  Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_70;
  vector<float,_std::allocator<float>_> local_50;
  MatrixXf local_38;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  _Var3 = (expression_model->
          super__Variant_base<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
          ).
          super__Move_assign_alias<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape>_>
          .
          super__Copy_assign_alias<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape>_>
          .
          super__Move_ctor_alias<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape>_>
          .
          super__Copy_ctor_alias<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape>_>
          .
          super__Variant_storage_alias<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape>_>
          ._M_index;
  if (_Var3 == '\x01') {
    blendshapes = std::
                  get<1ul,eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>
                            (expression_model);
    pBVar5 = (blendshapes->
             super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((blendshapes->
        super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
        )._M_impl.super__Vector_impl_data._M_finish == pBVar5) {
      __assert_fail("expression_blendshapes.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/ExpressionModel.hpp"
                    ,0x49,
                    "Eigen::VectorXf eos::morphablemodel::draw_sample(const ExpressionModel &, std::vector<float>)"
                   );
    }
    if ((expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar10 = (pBVar5->deformation).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      if (lVar10 < 0) {
        __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0x130,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<float, -1, 1>]"
                     );
      }
      Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                ((DenseStorage<float,__1,__1,_1,_0> *)this,lVar10,lVar10,1);
      lVar10 = *(long *)(this + 8);
      if (lVar10 < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, 1>]"
                     );
      }
      if (lVar10 != 0) {
        memset(*(void **)this,0,lVar10 << 2);
        lVar10 = extraout_RDX_04;
      }
    }
    else {
      to_matrix(&local_38,blendshapes);
      local_70.m_rhs.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                .super__Vector_impl_data._M_start;
      local_70.m_rhs.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           (long)(expression_coefficients->super__Vector_base<float,_std::allocator<float>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_70.m_rhs.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data >> 2;
      if (local_70.m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value < 0) {
        __assert_fail("vecSize >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                      ,0xa6,
                      "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<float, -1, 1>>>::MapBase(PointerType, Index) [Derived = Eigen::Map<const Eigen::Matrix<float, -1, 1>>, Level = 0]"
                     );
      }
      local_70.m_lhs = &local_38;
      if (local_38.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
          != local_70.m_rhs.
             super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Product.h"
                      ,0x62,
                      "Eigen::Product<Eigen::Matrix<float, -1, -1>, Eigen::Map<const Eigen::Matrix<float, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<float, -1, -1>, Rhs = Eigen::Map<const Eigen::Matrix<float, -1, 1>>, Option = 0]"
                     );
      }
      Eigen::internal::
      call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<float,float>>
                ((Matrix<float,__1,_1,_0,__1,_1> *)this,&local_70,&local_71,(type)0x0);
      free(local_38.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
          );
      lVar10 = extraout_RDX_02;
    }
  }
  else {
    if (_Var3 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "The given ExpressionModel doesn\'t contain an expression model in the form of a PcaModel or Blendshapes."
                );
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    coefficients = std::
                   get<0ul,eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>
                             (expression_model);
    if ((expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      pfVar6 = (coefficients->mean).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      size_00 = (coefficients->mean).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
      lVar10 = extraout_RDX;
      if (*(ulong *)(this + 8) != size_00) {
        if ((long)size_00 < 0) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                        ,0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, 1>]"
                       );
        }
        Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                  ((DenseStorage<float,__1,__1,_1,_0> *)this,size_00,size_00,1);
        lVar10 = extraout_RDX_03;
        if (*(ulong *)(this + 8) != size_00) {
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                        ,0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::Matrix<float, -1, 1>, T1 = float, T2 = float]"
                       );
        }
      }
      lVar7 = *(long *)this;
      uVar9 = size_00 + 3;
      if (-1 < (long)size_00) {
        uVar9 = size_00;
      }
      uVar9 = uVar9 & 0xfffffffffffffffc;
      if (3 < (long)size_00) {
        lVar10 = 0;
        do {
          pfVar1 = pfVar6 + lVar10;
          uVar8 = *(undefined8 *)(pfVar1 + 2);
          puVar2 = (undefined8 *)(lVar7 + lVar10 * 4);
          *puVar2 = *(undefined8 *)pfVar1;
          puVar2[1] = uVar8;
          lVar10 = lVar10 + 4;
        } while (lVar10 < (long)uVar9);
      }
      if ((long)uVar9 < (long)size_00) {
        do {
          *(float *)(lVar7 + uVar9 * 4) = pfVar6[uVar9];
          uVar9 = uVar9 + 1;
        } while (size_00 != uVar9);
      }
    }
    else {
      std::vector<float,_std::allocator<float>_>::vector(&local_50,expression_coefficients);
      PcaModel::draw_sample
                ((PcaModel *)&local_70,(vector<float,_std::allocator<float>_> *)coefficients);
      __ptr = *(LhsNested *)this;
      *(LhsNested *)this = local_70.m_lhs;
      pfVar4 = *(PointerType *)(this + 8);
      *(PointerType *)(this + 8) =
           local_70.m_rhs.
           super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
      local_70.m_lhs = __ptr;
      local_70.m_rhs.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pfVar4;
      free(__ptr);
      lVar10 = extraout_RDX_00;
      if (local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
        lVar10 = extraout_RDX_01;
      }
    }
  }
  VVar11.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = lVar10;
  VVar11.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)this;
  return (VectorXf)VVar11.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

inline Eigen::VectorXf draw_sample(const ExpressionModel& expression_model,
                                   std::vector<float> expression_coefficients)
{
    Eigen::VectorXf expression_sample;
    // Get a sample of the expression model, depending on whether it's a PcaModel or Blendshapes:
    if (cpp17::holds_alternative<PcaModel>(expression_model))
    {
        const auto& pca_expression_model = cpp17::get<PcaModel>(expression_model);
        if (expression_coefficients.empty())
        {
            expression_sample = pca_expression_model.get_mean();
        } else
        {
            expression_sample = pca_expression_model.draw_sample(expression_coefficients);
        }
    } else if (cpp17::holds_alternative<Blendshapes>(expression_model))
    {
        const auto& expression_blendshapes = cpp17::get<Blendshapes>(expression_model);
        assert(expression_blendshapes.size() > 0);
        if (expression_coefficients.empty())
        {
            expression_sample.setZero(expression_blendshapes[0].deformation.rows());
        } else
        {
            expression_sample = to_matrix(expression_blendshapes) *
                                Eigen::Map<const Eigen::VectorXf>(expression_coefficients.data(),
                                                                  expression_coefficients.size());
        }
    } else
    {
        throw std::runtime_error("The given ExpressionModel doesn't contain an expression model in the form "
                                 "of a PcaModel or Blendshapes.");
    }
    return expression_sample;
}